

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O1

char chaiscript::boxed_cast<char>(Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  char cVar1;
  element_type *peVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  bool bVar5;
  char *pcVar6;
  undefined8 *puVar7;
  undefined1 local_68 [8];
  _Rb_tree_impl<std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_true>
  _Stack_60;
  
  if (t_conversions != (Type_Conversions_State *)0x0) {
    local_68 = (undefined1  [8])&char::typeinfo;
    _Stack_60._0_8_ = &char::typeinfo;
    _Stack_60.super__Rb_tree_header._M_header._M_color = 0x10;
    bVar5 = Type_Info::bare_equal
                      (&((bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_type_info,(Type_Info *)local_68);
    if ((!bVar5) &&
       (bVar5 = Type_Conversions::convertable_type<char>((t_conversions->m_conversions)._M_data),
       bVar5)) {
      if ((t_conversions != (Type_Conversions_State *)0x0) &&
         (bVar5 = Type_Conversions::convertable_type<char>((t_conversions->m_conversions)._M_data),
         bVar5)) {
        _Stack_60.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&char::typeinfo;
        _Stack_60.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&char::typeinfo;
        _Stack_60.super__Rb_tree_header._M_header._M_right._0_4_ = 0x10;
        Type_Conversions::boxed_type_conversion
                  ((Type_Conversions *)local_68,(Type_Info *)(t_conversions->m_conversions)._M_data,
                   (Conversion_Saves *)&_Stack_60.super__Rb_tree_header._M_header._M_parent,
                   (Boxed_Value *)(t_conversions->m_saves)._M_data);
        pcVar6 = (char *)detail::verify_type<void>
                                   ((Boxed_Value *)local_68,(type_info *)&char::typeinfo,
                                    *(void **)((long)local_68 + 0x28));
        cVar1 = *pcVar6;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_60._0_8_ ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return cVar1;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_60._0_8_);
        return cVar1;
      }
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x38);
      peVar2 = (bv->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      _Stack_60.super__Rb_tree_header._M_header._M_color = (peVar2->m_type_info).m_flags;
      _Stack_60.super__Rb_tree_header._M_header._4_4_ =
           *(undefined4 *)&(peVar2->m_type_info).field_0x14;
      peVar3 = (element_type *)(peVar2->m_type_info).m_type_info;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (peVar2->m_type_info).m_bare_type_info;
      *puVar7 = &PTR__bad_cast_003b4620;
      local_68._0_4_ = SUB84(peVar3,0);
      local_68._4_4_ = (undefined4)((ulong)peVar3 >> 0x20);
      _Stack_60._0_4_ = SUB84(p_Var4,0);
      _Stack_60._4_4_ = SUB84((ulong)p_Var4 >> 0x20,0);
      *(undefined4 *)(puVar7 + 1) = local_68._0_4_;
      *(undefined4 *)((long)puVar7 + 0xc) = local_68._4_4_;
      *(undefined4 *)(puVar7 + 2) = _Stack_60._0_4_;
      *(undefined4 *)((long)puVar7 + 0x14) = _Stack_60._4_4_;
      puVar7[3] = _Stack_60.super__Rb_tree_header._M_header._0_8_;
      puVar7[4] = &char::typeinfo;
      puVar7[5] = 0x19;
      puVar7[6] = "Cannot perform boxed_cast";
      local_68 = (undefined1  [8])peVar3;
      _Stack_60._0_8_ = p_Var4;
      __cxa_throw(puVar7,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
    }
  }
  pcVar6 = (char *)detail::verify_type<void>
                             (bv,(type_info *)&char::typeinfo,
                              ((bv->m_data).
                               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->m_const_data_ptr);
  return *pcVar6;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }